

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
PairMatcherImpl<std::pair<std::__cxx11::string_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>
::PairMatcherImpl<char_const*,proto2_unittest::Proto2MapEnumPlusExtra>
          (PairMatcherImpl<std::pair<std::__cxx11::string_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>
           *this,char *first_matcher,Proto2MapEnumPlusExtra second_matcher)

{
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Proto2MapEnumPlusExtra local_1c;
  char *pcStack_18;
  Proto2MapEnumPlusExtra second_matcher_local;
  char *first_matcher_local;
  PairMatcherImpl<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
  *this_local;
  
  local_1c = second_matcher;
  pcStack_18 = first_matcher;
  first_matcher_local = (char *)this;
  MatcherInterface<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
  ::MatcherInterface((MatcherInterface<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                      *)this);
  *(undefined ***)this = &PTR__PairMatcherImpl_029d73f8;
  SafeMatcherCast<std::__cxx11::string_const&,char_const*>
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)(this + 8),(testing *)&stack0xffffffffffffffe8,
             (char **)CONCAT44(extraout_var,extraout_EDX));
  SafeMatcherCast<proto2_unittest::Proto2MapEnumPlusExtra_const&,proto2_unittest::Proto2MapEnumPlusExtra>
            ((Matcher<const_proto2_unittest::Proto2MapEnumPlusExtra_&> *)(this + 0x20),
             (testing *)&local_1c,
             (Proto2MapEnumPlusExtra *)CONCAT44(extraout_var_00,extraout_EDX_00));
  return;
}

Assistant:

PairMatcherImpl(FirstMatcher first_matcher, SecondMatcher second_matcher)
      : first_matcher_(
            testing::SafeMatcherCast<const FirstType&>(first_matcher)),
        second_matcher_(
            testing::SafeMatcherCast<const SecondType&>(second_matcher)) {}